

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanFlowEntry(Scanner *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  _Elt_pointer pFVar4;
  _Elt_pointer pFVar5;
  _Elt_pointer pFVar6;
  Token local_70;
  
  pFVar4 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar4 != (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pFVar5 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pFVar6 = pFVar4;
    if (pFVar4 == pFVar5) {
      pFVar6 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    if (pFVar6[-1] == FLOW_MAP) {
      bVar3 = VerifySimpleKey(this);
      if (bVar3) {
        local_70.mark.pos = (this->INPUT).m_mark.pos;
        local_70.mark.line = (this->INPUT).m_mark.line;
        local_70.mark.column = (this->INPUT).m_mark.column;
        local_70.value._M_dataplus._M_p = (pointer)&local_70.value.field_2;
        local_70.status = VALID;
        local_70.type = VALUE;
        local_70.value._M_string_length = 0;
        local_70.value.field_2._M_local_buf[0] = '\0';
        local_70.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_70.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        local_70.params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_70._76_8_ = 0;
        std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
                  (&(this->m_tokens).c,&local_70);
        Token::~Token(&local_70);
        goto LAB_006a8af6;
      }
      pFVar4 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pFVar5 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
    }
    if (pFVar4 == pFVar5) {
      pFVar4 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    if (pFVar4[-1] == FLOW_SEQ) {
      InvalidateSimpleKey(this);
    }
  }
LAB_006a8af6:
  this->m_simpleKeyAllowed = true;
  this->m_canBeJSONFlow = false;
  uVar2._0_4_ = (this->INPUT).m_mark.pos;
  uVar2._4_4_ = (this->INPUT).m_mark.line;
  iVar1 = (this->INPUT).m_mark.column;
  YAML::Stream::eat(&this->INPUT,1);
  local_70.value._M_dataplus._M_p = (pointer)&local_70.value.field_2;
  local_70.status = VALID;
  local_70.type = FLOW_ENTRY;
  local_70.value._M_string_length = 0;
  local_70.value.field_2._M_local_buf[0] = '\0';
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_70._76_8_ = 0;
  local_70.mark._0_8_ = uVar2;
  local_70.mark.column = iVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_70);
  Token::~Token(&local_70);
  return;
}

Assistant:

void Scanner::ScanFlowEntry() {
  // we might have a solo entry in the flow context
  if (InFlowContext()) {
    if (m_flows.top() == FLOW_MAP && VerifySimpleKey())
      m_tokens.push(Token(Token::VALUE, INPUT.mark()));
    else if (m_flows.top() == FLOW_SEQ)
      InvalidateSimpleKey();
  }

  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::FLOW_ENTRY, mark));
}